

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-opt.cpp
# Opt level: O3

void helper_after_test(char *func,bool high_level,string options,string subtest,bool subtest_ok,
                      int *ntest,int *npass)

{
  undefined7 in_register_00000011;
  char *pcVar1;
  undefined7 in_register_00000031;
  int *in_R9;
  
  pcVar1 = "no";
  if ((int)CONCAT71(in_register_00000031,high_level) != 0) {
    pcVar1 = "yes";
  }
  printf("  %s(high_level=%s%s, subtest=%s): ",func,pcVar1,CONCAT71(in_register_00000011,subtest_ok)
         ,ntest);
  if ((int)npass == 0) {
    puts("\x1b[1;31mFAIL\x1b[0m");
  }
  else {
    puts("\x1b[1;32mOK\x1b[0m");
    *(int *)options._M_dataplus._M_p = *(int *)options._M_dataplus._M_p + 1;
  }
  *in_R9 = *in_R9 + 1;
  return;
}

Assistant:

static void helper_after_test(
        const char * func, const bool high_level, const std::string options,
        const std::string subtest, const bool subtest_ok, int & ntest, int & npass) {
    printf("  %s(high_level=%s%s, subtest=%s): ",
           func, high_level ? "yes" : "no", options.c_str(), subtest.c_str());
    if (subtest_ok) {
        printf("\033[1;32mOK\033[0m\n");
        npass++;
    } else {
        printf("\033[1;31mFAIL\033[0m\n");
    }
    ntest++;
}